

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Options::Add<std::__cxx11::string>
          (Options *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var,
          char flag,string *long_flag,string *description,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_val,
          string *group)

{
  mapped_type *this_00;
  option op;
  string local_c8;
  string local_a8;
  string local_88;
  option local_68;
  _Bind<void_(Options::*(Options_*,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Placeholder<1>))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_48;
  
  std::__cxx11::string::string((string *)&local_88,long_flag);
  std::__cxx11::string::string((string *)&local_a8,description);
  std::__cxx11::string::string((string *)&local_c8,group);
  add_entry<std::__cxx11::string&>(this,&local_68,flag,&local_88,&local_a8,&local_c8,true);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  local_68.has_arg = 1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (var,default_val);
  local_48._M_f = (offset_in_Options_to_subr)set<std::__cxx11::string>;
  local_48._8_8_ = 0;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_Options_*,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Placeholder<1>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Placeholder<1>_>
  .
  super__Head_base<1UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_data =
       (_Head_base<1UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        )(_Head_base<1UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          )var;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_Options_*,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Placeholder<1>_>
  .super__Head_base<0UL,_Options_*,_false>._M_head_impl = this;
  this_00 = std::
            map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
            ::operator[](&this->setters,&local_68.val);
  std::function<void(std::__cxx11::string)>::operator=
            ((function<void(std::__cxx11::string)> *)this_00,&local_48);
  std::vector<option,_std::allocator<option>_>::push_back(&this->options,&local_68);
  return;
}

Assistant:

inline void Options::Add(T& var, char flag, std::string long_flag, std::string description, T default_val, std::string group) {
    struct option op;
    this->add_entry<T&>(op, flag, long_flag, description, group, true);

    op.has_arg = required_argument;
    var = default_val;

    this->setters[op.val] = std::bind(&Options::set<T>, this, std::ref(var), std::placeholders::_1);
    this->options.push_back(op);
}